

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O2

int write_int(int val,char *a)

{
  if (a != (char *)0x0) {
    *(int *)a = val;
    return 4;
  }
  return -1;
}

Assistant:

int write_int(int val, char *a) 
{
    if(a == nullptr)
    {
        return -1;
    }

    a[0] = val & 0xff;
    a[1] = (val >>8)  & 0xff;
    a[2] = (val >>16) & 0xff;
    a[3] = (val >>24) & 0xff;  
    return 4;
}